

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O0

void __thiscall Chromosome::process(Chromosome *this)

{
  Coordinate start_00;
  undefined1 local_1c [8];
  Coordinate start;
  Chromosome *this_local;
  
  if ((this->changed & 1U) != 0) {
    start._4_8_ = this;
    Coordinate::Coordinate((Coordinate *)local_1c);
    start_00.facing = start.x;
    start_00.x = local_1c._0_4_;
    start_00.y = local_1c._4_4_;
    createCoordinatePath(this,start_00);
    walkPath(this);
    calcFitness(this);
    this->changed = false;
  }
  return;
}

Assistant:

void Chromosome::process() {

    if (changed){
        Coordinate start;
        createCoordinatePath(start);
        walkPath();
        calcFitness();
        changed = false;
    }

}